

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall enact::BasicTypename::BasicTypename(BasicTypename *this,Token *name)

{
  Token *name_local;
  BasicTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__BasicTypename_0016a8d0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)&name->lexeme);
  Token::Token(&this->m_where,name);
  return;
}

Assistant:

BasicTypename::BasicTypename(Token name) :
            m_name{name.lexeme},
            m_where{std::move(name)} {}